

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O3

void __thiscall
SplitCompilationTest_empty_deque_Test<char32_t>::TestBody
          (SplitCompilationTest_empty_deque_Test<char32_t> *this)

{
  deque<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  split_result;
  AssertHelper local_a0 [8];
  long *local_98;
  char local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  long *local_80 [2];
  long local_70 [2];
  container_type_conflict26 local_60;
  
  jessilib::split<std::deque,_const_char32_t_*,_const_char32_t_*,_char32_t>
            (&local_60,(char32_t *)0x0,(char32_t *)0x0,L'\0');
  local_90[0] = local_60.
                super__Deque_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_60.
                super__Deque_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_90[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_80,local_90,"split_result.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x4e,(char *)local_80[0]);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  std::
  deque<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~deque(&local_60);
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_deque) {
	std::basic_string_view<TypeParam> empty;
	std::deque<std::basic_string<TypeParam>> split_result = split<std::deque>(empty, default_delim<TypeParam>);
	EXPECT_TRUE(split_result.empty());
}